

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  TestCaseInfo *in_RDI;
  
  *(undefined ***)&in_RDI->name = &PTR__TestCaseStats_004d22a0;
  std::__cxx11::string::~string((string *)&in_RDI[1].tags);
  std::__cxx11::string::~string((string *)&in_RDI[1].description);
  TestCaseInfo::~TestCaseInfo(in_RDI);
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() = default;